

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<2,_151>::
     BreitWignerReichMooreBase<njoy::ENDFtk::section::Type<2,_151>::BreitWignerLValue,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner>
     ::verifySize(int NLS)

{
  undefined8 *puVar1;
  
  if (0 < NLS) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal NLS value");
  tools::Log::info<char_const*>("NLS should be larger than zero");
  tools::Log::info<char_const*,int>("NLS value: {}",NLS);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NLS ) {

  if ( NLS < 1 ) {

    Log::error( "Encountered illegal NLS value" );
    Log::info( "NLS should be larger than zero" );
    Log::info( "NLS value: {}", NLS );
    throw std::exception();
  }
}